

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O2

int rhash_get_hash_length(uint hash_id)

{
  int iVar1;
  rhash_info *prVar2;
  
  prVar2 = rhash_info_by_id(hash_id);
  if (prVar2 == (rhash_info *)0x0) {
    iVar1 = 0;
  }
  else if ((prVar2->flags & 1) == 0) {
    iVar1 = (int)prVar2->digest_size * 2;
  }
  else {
    iVar1 = (int)((prVar2->digest_size * 8 + 4) / 5);
  }
  return iVar1;
}

Assistant:

RHASH_API int rhash_get_hash_length(unsigned hash_id)
{
	const rhash_info* info = rhash_info_by_id(hash_id);
	return (int)(info ? (info->flags & F_BS32 ?
		BASE32_LENGTH(info->digest_size) : info->digest_size * 2) : 0);
}